

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O0

int wrapped_vprintf(char *format,__va_list_tag *ap)

{
  long lVar1;
  code *pcVar2;
  long lStack_68;
  int return_val;
  curious_write_record_t io_args;
  curious_file_record_t *record;
  char *mount_point;
  char *filesystem;
  vprintf_f orig_vprintf;
  __va_list_tag *ap_local;
  char *format_local;
  
  lVar1 = __tls_get_addr(&PTR_00550710);
  *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + 1;
  pcVar2 = (code *)gotcha_get_wrappee(io_fns[0x1d].handle);
  lVar1 = __tls_get_addr(&PTR_00550710);
  if ((*(int *)(lVar1 + 0xc) == 1) && (wrappers_enabled != 0)) {
    io_args._32_8_ = get_curious_file_record(1);
    if ((curious_file_record_t *)io_args._32_8_ == (curious_file_record_t *)0x0) {
      mount_point = (char *)0x0;
      record = (curious_file_record_t *)0x0;
    }
    else {
      mount_point = ((curious_file_record_t *)io_args._32_8_)->filesystem;
      record = (curious_file_record_t *)((curious_file_record_t *)io_args._32_8_)->mount_point;
    }
    lStack_68 = 0;
    io_args.bytes_written._0_4_ = 0;
    io_args._8_8_ = mount_point;
    io_args.filesystem = (char *)record;
    io_args.mount_point._0_4_ = 0x1d;
    curious_call_callbacks(2,&stack0xffffffffffffff98);
    format_local._4_4_ = (*pcVar2)(format,ap);
    io_args.bytes_written._0_4_ = 1;
    if (0 < format_local._4_4_) {
      lStack_68 = (long)format_local._4_4_;
    }
    curious_call_callbacks(3,&stack0xffffffffffffff98);
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
  }
  else {
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
    format_local._4_4_ = (*pcVar2)(format,ap);
  }
  return format_local._4_4_;
}

Assistant:

int wrapped_vprintf(const char* format, va_list ap)
{
    WRAPPER_ENTER(vprintf);

    // Get the handle for the original function
    vprintf_f orig_vprintf = (vprintf_f) gotcha_get_wrappee(io_fns[CURIOUS_VPRINTF_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        char*                  filesystem;
        char*                  mount_point;
        curious_file_record_t* record = get_curious_file_record(STDOUT_FILENO);
        if (NULL == record) {
            filesystem  = NULL;
            mount_point = NULL;
        } else {
            filesystem  = record->filesystem;
            mount_point = record->mount_point;
        }

        curious_write_record_t io_args = {
            .bytes_written = 0,
            .call_count    = 0,
            .filesystem    = filesystem,
            .mount_point   = mount_point,
            .function_id   = CURIOUS_VPRINTF_ID,
        };
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK, &io_args);

        // Call the original, saving the result...
        int return_val     = orig_vprintf(format, ap);
        io_args.call_count = 1;
        if (return_val > 0) {
            io_args.bytes_written = return_val;
        }

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, vprintf);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_vprintf(format, ap), vprintf);
    }
}